

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

AssertionItemPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssertionItemPortListSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *args_1,Token *args_2)

{
  Token closeParen;
  Token openParen;
  AssertionItemPortListSyntax *this_00;
  
  this_00 = (AssertionItemPortListSyntax *)allocate(this,0x70,8);
  openParen.kind = args->kind;
  openParen._2_1_ = args->field_0x2;
  openParen.numFlags.raw = (args->numFlags).raw;
  openParen.rawLen = args->rawLen;
  openParen.info = args->info;
  closeParen.kind = args_2->kind;
  closeParen._2_1_ = args_2->field_0x2;
  closeParen.numFlags.raw = (args_2->numFlags).raw;
  closeParen.rawLen = args_2->rawLen;
  closeParen.info = args_2->info;
  syntax::AssertionItemPortListSyntax::AssertionItemPortListSyntax
            (this_00,openParen,args_1,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }